

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::GenTypeSize_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,Type *type)

{
  allocator<char> local_9;
  
  if (type->base_type - BASE_TYPE_UTYPE < 0xc) {
    GenTypeBasic_abi_cxx11_(__return_storage_ptr__,this,type,false);
  }
  else if ((type->base_type == BASE_TYPE_STRUCT) && (type->struct_def->fixed == true)) {
    GenTypePointer_abi_cxx11_(__return_storage_ptr__,this,type);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"::flatbuffers::uoffset_t",&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeSize(const Type &type) const {
    if (IsScalar(type.base_type)) {
      return GenTypeBasic(type, false);
    } else if (IsStruct(type)) {
      return GenTypePointer(type);
    } else {
      return "::flatbuffers::uoffset_t";
    }
  }